

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_compress_open(char *filename,int rwmode,int *hdl)

{
  FILE *pFVar1;
  char *in_RDI;
  char *cptr;
  int status;
  FILE *outdiskfile;
  FILE *indiskfile;
  int *in_stack_00000040;
  FILE *in_stack_00000048;
  FILE *in_stack_00000050;
  char *in_stack_00000058;
  FILE **in_stack_00000448;
  int in_stack_00000454;
  char *in_stack_00000458;
  int *in_stack_00000b18;
  int in_stack_00000b24;
  char *in_stack_00000b28;
  char *local_40;
  FILE *local_28;
  int local_4;
  
  local_4 = file_openfile(in_stack_00000458,in_stack_00000454,in_stack_00000448);
  if (local_4 == 0) {
    local_40 = file_outfile;
    if (file_outfile[0] == '!') {
      local_40 = file_outfile + 1;
      remove(file_outfile + 1);
    }
    else {
      pFVar1 = fopen64(file_outfile,"r");
      if (pFVar1 != (FILE *)0x0) {
        ffpmsg((char *)0x119180);
        ffpmsg((char *)0x11918c);
        fclose(pFVar1);
        file_outfile[0] = '\0';
        return 0x69;
      }
    }
    pFVar1 = fopen64(local_40,"w+b");
    if (pFVar1 == (FILE *)0x0) {
      ffpmsg((char *)0x1191d6);
      ffpmsg((char *)0x1191e2);
      file_outfile[0] = '\0';
      local_4 = 0x69;
    }
    else {
      uncompress2file(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
      fclose(local_28);
      fclose(pFVar1);
      strcpy(in_RDI,local_40);
      file_outfile[0] = '\0';
      local_4 = file_open(in_stack_00000b28,in_stack_00000b24,in_stack_00000b18);
    }
  }
  else {
    ffpmsg((char *)0x11910a);
    ffpmsg((char *)0x119114);
  }
  return local_4;
}

Assistant:

int file_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile by creating a new uncompressed
  file then opening it.  The input file name (the name of the compressed
  file) gets replaced with the name of the uncompressed file, which is
  initially stored in the global file_outfile string.   file_outfile
  then gets set to a null string.
*/
{
    FILE *indiskfile, *outdiskfile;
    int status;
    char *cptr;

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &indiskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (file_compress_open)");
        ffpmsg(filename);
        return(status);
    }

    /* name of the output uncompressed file is stored in the */
    /* global variable called 'file_outfile'.                */

    cptr = file_outfile;
    if (*cptr == '!')
    {
        /* clobber any existing file with the same name */
        cptr++;
        remove(cptr);
    }
    else
    {
        outdiskfile = fopen(file_outfile, "r"); /* does file already exist? */

        if (outdiskfile)
        {
          ffpmsg("uncompressed file already exists: (file_compress_open)");
          ffpmsg(file_outfile);
          fclose(outdiskfile);         /* close file and exit with error */
	  file_outfile[0] = '\0';
          return(FILE_NOT_CREATED); 
        }
    }

    outdiskfile = fopen(cptr, "w+b"); /* create new file */
    if (!outdiskfile)
    {
        ffpmsg("could not create uncompressed file: (file_compress_open)");
        ffpmsg(file_outfile);
	file_outfile[0] = '\0';
        return(FILE_NOT_CREATED); 
    }

    /* uncompress file into another file */
    uncompress2file(filename, indiskfile, outdiskfile, &status);
    fclose(indiskfile);
    fclose(outdiskfile);

    if (status)
    {
        ffpmsg("error in file_compress_open: failed to uncompressed file:");
        ffpmsg(filename);
        ffpmsg(" into new output file:");
        ffpmsg(file_outfile);
	file_outfile[0] = '\0';
        return(status);
    }

    strcpy(filename, cptr);  /* switch the names */
    file_outfile[0] = '\0';

    status = file_open(filename, rwmode, hdl);

    return(status);
}